

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Close(sqlite3 *db,int forceZombie)

{
  Schema *pSVar1;
  Table *p;
  int iVar2;
  HashElem *pHVar3;
  long lVar4;
  
  iVar2 = 0;
  if (db != (sqlite3 *)0x0) {
    iVar2 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar2 == 0) {
      iVar2 = 0x15;
      sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x26041,
                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    }
    else {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      if ((db->mTrace & 8) != 0) {
        (*db->xTrace)(8,db->pTraceArg,db,(void *)0x0);
      }
      if (db->noSharedCache == '\0') {
        btreeEnterAll(db);
      }
      if (0 < db->nDb) {
        lVar4 = 0;
        do {
          pSVar1 = db->aDb[lVar4].pSchema;
          if (pSVar1 != (Schema *)0x0) {
            for (pHVar3 = (pSVar1->tblHash).first; pHVar3 != (HashElem *)0x0; pHVar3 = pHVar3->next)
            {
              if (((Table *)pHVar3->data)->nModuleArg != 0) {
                sqlite3VtabDisconnect(db,(Table *)pHVar3->data);
              }
            }
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < db->nDb);
      }
      for (pHVar3 = (db->aModule).first; pHVar3 != (HashElem *)0x0; pHVar3 = pHVar3->next) {
        p = *(Table **)((long)pHVar3->data + 0x20);
        if (p != (Table *)0x0) {
          sqlite3VtabDisconnect(db,p);
        }
      }
      sqlite3VtabUnlockList(db);
      if (db->noSharedCache == '\0') {
        btreeLeaveAll(db);
      }
      callFinaliser(db,0x88);
      if ((forceZombie == 0) && (iVar2 = connectionIsBusy(db), iVar2 != 0)) {
        sqlite3ErrorWithMsg(db,5,
                            "unable to close due to unfinalized statements or unfinished backups");
        if (db->mutex == (sqlite3_mutex *)0x0) {
          return 5;
        }
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
        return 5;
      }
      db->magic = 0x64cffc7f;
      sqlite3LeaveMutexAndCloseZombie(db);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int sqlite3Close(sqlite3 *db, int forceZombie){
  if( !db ){
    /* EVIDENCE-OF: R-63257-11740 Calling sqlite3_close() or
    ** sqlite3_close_v2() with a NULL pointer argument is a harmless no-op. */
    return SQLITE_OK;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mTrace & SQLITE_TRACE_CLOSE ){
    db->xTrace(SQLITE_TRACE_CLOSE, db->pTraceArg, db, 0);
  }

  /* Force xDisconnect calls on all virtual tables */
  disconnectAllVtab(db);

  /* If a transaction is open, the disconnectAllVtab() call above
  ** will not have called the xDisconnect() method on any virtual
  ** tables in the db->aVTrans[] array. The following sqlite3VtabRollback()
  ** call will do so. We need to do this before the check for active
  ** SQL statements below, as the v-table implementation may be storing
  ** some prepared statements internally.
  */
  sqlite3VtabRollback(db);

  /* Legacy behavior (sqlite3_close() behavior) is to return
  ** SQLITE_BUSY if the connection can not be closed immediately.
  */
  if( !forceZombie && connectionIsBusy(db) ){
    sqlite3ErrorWithMsg(db, SQLITE_BUSY, "unable to close due to unfinalized "
       "statements or unfinished backups");
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_BUSY;
  }

#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Closing the handle. Fourth parameter is passed the value 2. */
    sqlite3GlobalConfig.xSqllog(sqlite3GlobalConfig.pSqllogArg, db, 0, 2);
  }
#endif

  /* Convert the connection into a zombie and then close it.
  */
  db->magic = SQLITE_MAGIC_ZOMBIE;
  sqlite3LeaveMutexAndCloseZombie(db);
  return SQLITE_OK;
}